

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdsmf.c
# Opt level: O1

DUH * dumb_read_riff_dsmf(DUMBFILE *f,riff *stream)

{
  riff_chunk *prVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  DUMB_IT_SIGDATA *sigdata_00;
  uchar *puVar6;
  IT_PATTERN *pIVar7;
  IT_SAMPLE *pIVar8;
  DUH *pDVar9;
  char cVar10;
  uchar uVar11;
  uchar uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  DUH_SIGTYPE_DESC *descptr;
  sigdata_t *sigdata;
  char *tag [2] [2];
  DUH_SIGTYPE_DESC *local_68;
  DUMB_IT_SIGDATA *local_60;
  char *local_58;
  DUMB_IT_SIGDATA *local_50;
  char *local_48;
  char *local_40;
  
  local_68 = &_dumb_sigtype_it;
  if (((stream != (riff *)0x0) && (stream->type == 0x44534d46)) &&
     (sigdata_00 = (DUMB_IT_SIGDATA *)malloc(0x138), sigdata_00 != (DUMB_IT_SIGDATA *)0x0)) {
    sigdata_00->n_samples = 0;
    sigdata_00->n_patterns = 0;
    sigdata_00->name[0] = '\0';
    uVar15 = (ulong)stream->chunk_count;
    if (uVar15 != 0) {
      prVar1 = stream->chunks;
      lVar13 = 0;
      bVar2 = false;
      do {
        iVar5 = *(int *)((long)&prVar1->type + lVar13);
        if (iVar5 == 0x494e5354) {
          sigdata_00->n_samples = sigdata_00->n_samples + 1;
LAB_006e86f8:
          iVar5 = 0;
        }
        else {
          if (iVar5 == 0x50415454) {
            sigdata_00->n_patterns = sigdata_00->n_patterns + 1;
            goto LAB_006e86f8;
          }
          if (iVar5 != 0x534f4e47) goto LAB_006e86f8;
          iVar5 = 7;
          if (!bVar2) {
            bVar16 = *(uint *)((long)&prVar1->size + lVar13) < 0xc0;
            iVar5 = 0;
            if (bVar16) {
              iVar5 = 7;
            }
            if (!bVar16) {
              bVar2 = true;
            }
          }
        }
        if (iVar5 != 0) {
          if (iVar5 != 7) goto LAB_006e8ba1;
          goto LAB_006e8b97;
        }
        lVar13 = lVar13 + 0x18;
      } while (uVar15 * 0x18 != lVar13);
      if (((bVar2) && (sigdata_00->n_samples != 0)) &&
         ((sigdata_00->n_patterns < 0x100 &&
          ((sigdata_00->n_samples < 0x100 && (sigdata_00->n_patterns != 0)))))) {
        sigdata_00->song_message = (uchar *)0x0;
        sigdata_00->n_orders = 0;
        sigdata_00->n_instruments = 0;
        sigdata_00->order = (uchar *)0x0;
        sigdata_00->instrument = (IT_INSTRUMENT *)0x0;
        sigdata_00->sample = (IT_SAMPLE *)0x0;
        sigdata_00->pattern = (IT_PATTERN *)0x0;
        sigdata_00->midi = (IT_MIDI *)0x0;
        sigdata_00->checkpoint = (IT_CHECKPOINT *)0x0;
        sigdata_00->mixing_volume = 0x30;
        sigdata_00->pan_separation = 0x80;
        sigdata_00->restart_position = '\0';
        builtin_memcpy(sigdata_00->channel_volume,
                       "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x40);
        cVar10 = (char)(uint)((ulong)((long)(dumb_it_default_panning_separation << 5) * 0x51eb851f)
                             >> 0x25) - (char)((dumb_it_default_panning_separation << 5) >> 0x1f);
        uVar12 = ' ' - cVar10;
        uVar11 = cVar10 + ' ';
        uVar14 = 0xfffffffffffffffc;
        do {
          sigdata_00->channel_pan[uVar14 + 4] = uVar12;
          sigdata_00->channel_pan[uVar14 + 5] = uVar11;
          sigdata_00->channel_pan[uVar14 + 6] = uVar11;
          sigdata_00->channel_pan[uVar14 + 7] = uVar12;
          uVar14 = uVar14 + 4;
        } while (uVar14 < 0x3c);
        if (uVar15 != 0) {
          uVar15 = 0;
          do {
            iVar5 = 0;
            if (stream->chunks[uVar15].type == 0x534f4e47) {
              iVar4 = dumbfile_seek(f,(long)stream->chunks[uVar15].offset,0);
              iVar5 = 0xf;
              if (iVar4 == 0) {
                dumbfile_getnc((char *)sigdata_00,0x1c,f);
                sigdata_00->name[0x1c] = '\0';
                sigdata_00->flags = 0x31;
                dumbfile_skip(f,8);
                iVar4 = dumbfile_igetw(f);
                sigdata_00->n_orders = iVar4;
                dumbfile_skip(f,4);
                iVar4 = dumbfile_igetw(f);
                sigdata_00->n_pchannels = iVar4;
                iVar4 = dumbfile_getc(f);
                sigdata_00->global_volume = iVar4;
                iVar4 = dumbfile_getc(f);
                sigdata_00->mixing_volume = iVar4;
                iVar4 = dumbfile_getc(f);
                sigdata_00->speed = iVar4;
                iVar4 = dumbfile_getc(f);
                sigdata_00->tempo = iVar4;
                lVar13 = 0;
                do {
                  iVar4 = dumbfile_getc(f);
                  sigdata_00->channel_pan[lVar13] = (uchar)((uint)(iVar4 - (iVar4 >> 0x1f)) >> 1);
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 0x10);
                puVar6 = (uchar *)malloc(0x80);
                sigdata_00->order = puVar6;
                if (puVar6 != (uchar *)0x0) {
                  dumbfile_getnc((char *)puVar6,0x80,f);
                  iVar5 = 0;
                }
              }
            }
            if (iVar5 != 0) {
              if (iVar5 != 0xf) goto LAB_006e8ba1;
              goto LAB_006e8c08;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < stream->chunk_count);
        }
        iVar5 = sigdata_00->n_patterns;
        pIVar7 = (IT_PATTERN *)malloc((long)iVar5 << 4);
        sigdata_00->pattern = pIVar7;
        auVar3 = _DAT_007140f0;
        if (pIVar7 != (IT_PATTERN *)0x0) {
          if (0 < iVar5) {
            lVar13 = (long)iVar5 + -1;
            auVar17._8_4_ = (int)lVar13;
            auVar17._0_8_ = lVar13;
            auVar17._12_4_ = (int)((ulong)lVar13 >> 0x20);
            lVar13 = 0;
            auVar17 = auVar17 ^ _DAT_007140f0;
            auVar21 = _DAT_00771ac0;
            do {
              auVar20 = auVar21 ^ auVar3;
              if ((bool)(~(auVar20._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar20._0_4_ ||
                          auVar17._4_4_ < auVar20._4_4_) & 1)) {
                *(undefined8 *)((long)&pIVar7->entry + lVar13) = 0;
              }
              if ((auVar20._12_4_ != auVar17._12_4_ || auVar20._8_4_ <= auVar17._8_4_) &&
                  auVar20._12_4_ <= auVar17._12_4_) {
                *(undefined8 *)((long)&pIVar7[1].entry + lVar13) = 0;
              }
              lVar19 = auVar21._8_8_;
              auVar21._0_8_ = auVar21._0_8_ + 2;
              auVar21._8_8_ = lVar19 + 2;
              lVar13 = lVar13 + 0x20;
            } while ((ulong)(iVar5 + 1U >> 1) << 5 != lVar13);
          }
          iVar5 = sigdata_00->n_samples;
          pIVar8 = (IT_SAMPLE *)malloc((long)iVar5 * 0x68);
          sigdata_00->sample = pIVar8;
          auVar3 = _DAT_007140f0;
          if (pIVar8 != (IT_SAMPLE *)0x0) {
            if (0 < iVar5) {
              lVar13 = (long)iVar5 + -1;
              auVar18._8_4_ = (int)lVar13;
              auVar18._0_8_ = lVar13;
              auVar18._12_4_ = (int)((ulong)lVar13 >> 0x20);
              lVar13 = 0;
              auVar18 = auVar18 ^ _DAT_007140f0;
              auVar20 = _DAT_00771ac0;
              do {
                auVar21 = auVar20 ^ auVar3;
                if ((bool)(~(auVar21._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar21._0_4_ ||
                            auVar18._4_4_ < auVar21._4_4_) & 1)) {
                  puVar6 = pIVar8->filename + lVar13 + 0x35;
                  puVar6[0] = '\0';
                  puVar6[1] = '\0';
                  puVar6[2] = '\0';
                  puVar6[3] = '\0';
                  puVar6[4] = '\0';
                  puVar6[5] = '\0';
                  puVar6[6] = '\0';
                  puVar6[7] = '\0';
                }
                if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
                    auVar21._12_4_ <= auVar18._12_4_) {
                  puVar6 = pIVar8[1].filename + lVar13 + 0x35;
                  puVar6[0] = '\0';
                  puVar6[1] = '\0';
                  puVar6[2] = '\0';
                  puVar6[3] = '\0';
                  puVar6[4] = '\0';
                  puVar6[5] = '\0';
                  puVar6[6] = '\0';
                  puVar6[7] = '\0';
                }
                lVar19 = auVar20._8_8_;
                auVar20._0_8_ = auVar20._0_8_ + 2;
                auVar20._8_8_ = lVar19 + 2;
                lVar13 = lVar13 + 0xd0;
              } while ((ulong)(iVar5 + 1U >> 1) * 0xd0 - lVar13 != 0);
            }
            sigdata_00->n_samples = 0;
            sigdata_00->n_patterns = 0;
            if (stream->chunk_count != 0) {
              lVar13 = 8;
              uVar15 = 0;
              do {
                prVar1 = stream->chunks;
                iVar5 = *(int *)((long)prVar1 + lVar13 + -8);
                if (iVar5 == 0x494e5354) {
                  iVar5 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar13 + -4),0);
                  iVar4 = 0xf;
                  if (iVar5 == 0) {
                    iVar5 = it_riff_dsmf_process_sample
                                      (sigdata_00->sample + sigdata_00->n_samples,f,
                                       *(int *)((long)&prVar1->type + lVar13));
                    iVar4 = 0xf;
                    if (iVar5 == 0) {
                      sigdata_00->n_samples = sigdata_00->n_samples + 1;
LAB_006e8b65:
                      iVar4 = 0;
                    }
                  }
                }
                else {
                  iVar4 = 0;
                  if (iVar5 == 0x50415454) {
                    iVar5 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar13 + -4),0);
                    iVar4 = 0xf;
                    if (iVar5 == 0) {
                      iVar5 = it_riff_dsmf_process_pattern
                                        (sigdata_00->pattern + sigdata_00->n_patterns,f,
                                         *(int *)((long)&prVar1->type + lVar13));
                      iVar4 = 0xf;
                      if (iVar5 == 0) {
                        sigdata_00->n_patterns = sigdata_00->n_patterns + 1;
                        goto LAB_006e8b65;
                      }
                    }
                  }
                }
                if (iVar4 != 0) {
                  if (iVar4 == 0xf) goto LAB_006e8c08;
                  goto LAB_006e8ba1;
                }
                uVar15 = uVar15 + 1;
                lVar13 = lVar13 + 0x18;
              } while (uVar15 < stream->chunk_count);
            }
            _dumb_it_fix_invalid_orders(sigdata_00);
            goto LAB_006e8ba1;
          }
        }
LAB_006e8c08:
        _dumb_it_unload_sigdata(sigdata_00);
        goto LAB_006e8b9f;
      }
    }
LAB_006e8b97:
    free(sigdata_00);
  }
LAB_006e8b9f:
  sigdata_00 = (DUMB_IT_SIGDATA *)0x0;
LAB_006e8ba1:
  if (sigdata_00 == (DUMB_IT_SIGDATA *)0x0) {
    pDVar9 = (DUH *)0x0;
  }
  else {
    local_58 = "TITLE";
    local_48 = "FORMAT";
    local_40 = "RIFF DSMF";
    local_60 = sigdata_00;
    local_50 = sigdata_00;
    pDVar9 = make_duh(-1,2,(char *(*) [2])&local_58,1,&local_68,&local_60);
  }
  return pDVar9;
}

Assistant:

DUH *dumb_read_riff_dsmf( DUMBFILE * f, struct riff * stream )
{
	sigdata_t *sigdata;

	DUH_SIGTYPE_DESC *descptr = &_dumb_sigtype_it;

    sigdata = it_riff_dsmf_load_sigdata( f, stream );

	if (!sigdata)
		return NULL;

	{
		const char *tag[2][2];
		tag[0][0] = "TITLE";
        tag[0][1] = (const char *)(((DUMB_IT_SIGDATA *)sigdata)->name);
		tag[1][0] = "FORMAT";
		tag[1][1] = "RIFF DSMF";
		return make_duh( -1, 2, ( const char * const (*) [ 2 ] ) tag, 1, & descptr, & sigdata );
	}
}